

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void scale_component_up(opj_image_comp_t *component,OPJ_UINT32 precision)

{
  OPJ_UINT32 OVar1;
  OPJ_INT32 *pOVar2;
  ulong uVar3;
  OPJ_UINT32 *l_data_1;
  OPJ_UINT64 oldMax_1;
  OPJ_UINT64 newMax_1;
  OPJ_INT32 *l_data;
  OPJ_INT64 oldMax;
  OPJ_INT64 newMax;
  OPJ_SIZE_T len;
  OPJ_SIZE_T i;
  OPJ_UINT32 precision_local;
  opj_image_comp_t *component_local;
  
  uVar3 = (ulong)component->w * (ulong)component->h;
  if (component->sgnd == 0) {
    OVar1 = component->prec;
    pOVar2 = component->data;
    for (len = 0; len < uVar3; len = len + 1) {
      pOVar2[len] = (OPJ_INT32)
                    (((ulong)(uint)pOVar2[len] * (ulong)((1 << ((byte)precision & 0x1f)) - 1)) /
                    (ulong)((1 << ((byte)OVar1 & 0x1f)) - 1));
    }
  }
  else {
    OVar1 = component->prec;
    pOVar2 = component->data;
    for (len = 0; len < uVar3; len = len + 1) {
      pOVar2[len] = (OPJ_INT32)
                    ((long)((long)pOVar2[len] * (ulong)(uint)(1 << ((byte)precision - 1 & 0x1f))) /
                    (long)(ulong)(uint)(1 << ((char)OVar1 - 1U & 0x1f)));
    }
  }
  component->prec = precision;
  component->bpp = precision;
  return;
}

Assistant:

static void scale_component_up(opj_image_comp_t* component, OPJ_UINT32 precision)
{
	OPJ_SIZE_T i, len;
	
	len = (OPJ_SIZE_T)component->w * (OPJ_SIZE_T)component->h;
	if (component->sgnd) {
		OPJ_INT64  newMax = (OPJ_INT64)(1U << (precision - 1));
		OPJ_INT64  oldMax = (OPJ_INT64)(1U << (component->prec - 1));
		OPJ_INT32* l_data = component->data;
		for (i = 0; i < len; ++i) {
			l_data[i] = (OPJ_INT32)(((OPJ_INT64)l_data[i] * newMax) / oldMax);
		}
	} else {
		OPJ_UINT64  newMax = (OPJ_UINT64)((1U << precision) - 1U);
		OPJ_UINT64  oldMax = (OPJ_UINT64)((1U << component->prec) - 1U);
		OPJ_UINT32* l_data = (OPJ_UINT32*)component->data;
		for (i = 0; i < len; ++i) {
			l_data[i] = (OPJ_UINT32)(((OPJ_UINT64)l_data[i] * newMax) / oldMax);
		}
	}
	component->prec = precision;
	component->bpp = precision;
}